

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_CDict *
ZSTD_createCDict_advanced
          (void *dictBuffer,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_compressionParameters cParams,
          ZSTD_customMem customMem)

{
  ZSTD_CDict *cdict;
  size_t sVar1;
  long lVar2;
  void *alloc;
  long lVar3;
  size_t __size;
  ZSTD_cwksp local_70;
  
  if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
      (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    lVar2 = 0;
    if (cParams.strategy != ZSTD_fast) {
      lVar2 = 4L << ((byte)cParams.chainLog & 0x3f);
    }
    lVar3 = (dictSize + 7 & 0xfffffffffffffff8) + 0x2b40;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
      lVar3 = 0x2b40;
    }
    __size = lVar3 + (4L << ((byte)cParams.hashLog & 0x3f)) + lVar2;
    if (customMem.customAlloc == (ZSTD_allocFunction)0x0) {
      cdict = (ZSTD_CDict *)malloc(__size);
    }
    else {
      cdict = (ZSTD_CDict *)(*customMem.customAlloc)(customMem.opaque,__size);
    }
    if (cdict != (ZSTD_CDict *)0x0) {
      if (((ulong)cdict & 7) != 0) {
        __assert_fail("((size_t)start & (sizeof(void*)-1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1dad,"void ZSTD_cwksp_init(ZSTD_cwksp *, void *, size_t)");
      }
      local_70.workspaceEnd = (void *)((long)&cdict->dictContent + __size);
      local_70.phase = ZSTD_cwksp_alloc_objects;
      local_70.allocFailed = 0;
      local_70.workspace = cdict;
      local_70.objectEnd = cdict;
      local_70.tableEnd = cdict;
      local_70.tableValidEnd = cdict;
      local_70.allocStart = local_70.workspaceEnd;
      ZSTD_cwksp_assert_internal_consistency(&local_70);
      local_70.workspaceOversizedDuration = 0;
      ZSTD_cwksp_assert_internal_consistency(&local_70);
      ZSTD_cwksp_assert_internal_consistency(&local_70);
      if ((long)__size < 0x1340) {
        __assert_fail("cdict != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3789,
                      "ZSTD_CDict *ZSTD_createCDict_advanced(const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_compressionParameters, ZSTD_customMem)"
                     );
      }
      local_70.objectEnd = cdict + 1;
      (cdict->workspace).workspace = local_70.workspace;
      (cdict->workspace).workspaceEnd = local_70.workspaceEnd;
      (cdict->workspace).objectEnd = local_70.objectEnd;
      (cdict->workspace).tableEnd = local_70.objectEnd;
      (cdict->workspace).tableValidEnd = local_70.objectEnd;
      (cdict->workspace).allocStart = local_70.allocStart;
      (cdict->workspace).allocFailed = local_70.allocFailed;
      (cdict->workspace).workspaceOversizedDuration = local_70.workspaceOversizedDuration;
      *(ulong *)&(cdict->workspace).phase = CONCAT44(local_70._60_4_,local_70.phase);
      (cdict->customMem).opaque = customMem.opaque;
      (cdict->customMem).customAlloc = customMem.customAlloc;
      (cdict->customMem).customFree = customMem.customFree;
      cdict->compressionLevel = 0;
      local_70.tableEnd = local_70.objectEnd;
      local_70.tableValidEnd = local_70.objectEnd;
      sVar1 = ZSTD_initCDict_internal
                        (cdict,dictBuffer,dictSize,dictLoadMethod,dictContentType,cParams);
      if (sVar1 < 0xffffffffffffff89) {
        return cdict;
      }
      ZSTD_freeCDict(cdict);
    }
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced(const void* dictBuffer, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_compressionParameters cParams, ZSTD_customMem customMem)
{
    DEBUGLOG(3, "ZSTD_createCDict_advanced, mode %u", (unsigned)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    {   size_t const workspaceSize =
            ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict)) +
            ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE) +
            ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0) +
            (dictLoadMethod == ZSTD_dlm_byRef ? 0
             : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))));
        void* const workspace = ZSTD_malloc(workspaceSize, customMem);
        ZSTD_cwksp ws;
        ZSTD_CDict* cdict;

        if (!workspace) {
            ZSTD_free(workspace, customMem);
            return NULL;
        }

        ZSTD_cwksp_init(&ws, workspace, workspaceSize);

        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        assert(cdict != NULL);
        ZSTD_cwksp_move(&cdict->workspace, &ws);
        cdict->customMem = customMem;
        cdict->compressionLevel = 0; /* signals advanced API usage */

        if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                        dictBuffer, dictSize,
                                        dictLoadMethod, dictContentType,
                                        cParams) )) {
            ZSTD_freeCDict(cdict);
            return NULL;
        }

        return cdict;
    }
}